

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

char * cali_get_current_region_or(char *alt)

{
  bool bVar1;
  Entry e;
  Caliper c;
  Entry local_58;
  cali_variant_t local_40;
  Caliper local_30;
  
  cali::Caliper::sigsafe_instance();
  bVar1 = cali::Caliper::operator_cast_to_bool(&local_30);
  if (bVar1) {
    cali::Caliper::get_path_node(&local_58,&local_30);
    if ((local_58.m_node != (Node *)0x0) && ((char)local_58.m_value.m_v.type_and_size == '\x04')) {
      local_40.type_and_size = local_58.m_value.m_v.type_and_size;
      local_40.value = local_58.m_value.m_v.value;
      alt = (char *)cali_variant_get_data(&local_40);
    }
  }
  return alt;
}

Assistant:

const char* cali_get_current_region_or(const char* alt)
{
    Caliper c = Caliper::sigsafe_instance();

    if (!c)
        return alt;

    Entry e = c.get_path_node();

    if (!e.empty() && e.value().type() == CALI_TYPE_STRING)
        return static_cast<const char*>(e.value().data());

    return alt;
}